

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifinc(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *prVar2;
  int cnt;
  
  cnt = 1;
  if (argc == 1) {
    prVar1 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar1 + -1;
    prVar2 = ctx->bifcxrun;
    if (prVar1[-1].runstyp != '\x01') {
      prVar2->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    cnt = *(int *)&prVar2->runcxsp->runsv;
    if (cnt < 1) {
      prVar2->runcxerr->errcxptr->erraav[0].errastr = "incturn";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x400);
    }
  }
  vocturn(ctx->bifcxrun->runcxvoc,cnt,1);
  return;
}

Assistant:

void bifinc(bifcxdef *ctx, int argc)
{
    int turncnt;
    
    if (argc == 1)
    {
        /* get the number of turns to skip */
        turncnt = runpopnum(ctx->bifcxrun);
        if (turncnt < 1)
            runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "incturn");
    }
    else
    {
        /* no arguments -> increment by one turn */
        bifcntargs(ctx, 0, argc);
        turncnt = 1;
    }

    /* skip the given number of turns */
    vocturn(ctx->bifcxrun->runcxvoc, turncnt, TRUE);
}